

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-util.cc
# Opt level: O2

void wabt::interp::WriteValues(Stream *stream,ValueTypes *types,Values *values)

{
  u64 *puVar1;
  pointer pVVar2;
  pointer pVVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  TypedValue local_50;
  
  pVVar3 = (values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2 == ((long)pVVar2 - (long)pVVar3) / 0x18) {
    lVar4 = 0;
    for (uVar5 = 0; uVar5 < (ulong)(((long)pVVar2 - (long)pVVar3) / 0x18); uVar5 = uVar5 + 1) {
      local_50.type.enum_ =
           (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar5].enum_;
      local_50.value.type.enum_ = *(Enum *)((long)&(pVVar3->type).enum_ + lVar4);
      puVar1 = (u64 *)((long)&pVVar3->field_0 + lVar4);
      local_50.value.field_0.i64_ = *puVar1;
      local_50.value.field_0._8_8_ = puVar1[1];
      WriteValue(stream,&local_50);
      pVVar3 = (values->
               super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2 = (values->
               super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (uVar5 != ((long)pVVar2 - (long)pVVar3) / 0x18 - 1U) {
        Stream::Writef(stream,", ",((long)pVVar2 - (long)pVVar3) % 0x18);
        pVVar3 = (values->
                 super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar2 = (values->
                 super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      lVar4 = lVar4 + 0x18;
    }
    return;
  }
  __assert_fail("types.size() == values.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp-util.cc"
                ,0x53,"void wabt::interp::WriteValues(Stream *, const ValueTypes &, const Values &)"
               );
}

Assistant:

void WriteValues(Stream* stream,
                 const ValueTypes& types,
                 const Values& values) {
  assert(types.size() == values.size());
  for (size_t i = 0; i < values.size(); ++i) {
    WriteValue(stream, TypedValue{types[i], values[i]});
    if (i != values.size() - 1) {
      stream->Writef(", ");
    }
  }
}